

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tb_invalidate_phys_page_fast_aarch64
               (uc_struct_conflict2 *uc,page_collection *pages,tb_page_addr_t start,int len,
               uintptr_t retaddr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  PageDesc *pages_00;
  unsigned_long *puVar4;
  ulong uVar5;
  uint uVar6;
  uintptr_t in_R9;
  undefined8 *puVar7;
  
  pages_00 = page_find_alloc(uc,start >> ((byte)uc->init_target_page->bits & 0x3f),0);
  if (pages_00 != (PageDesc *)0x0) {
    puVar4 = pages_00->code_bitmap;
    if (puVar4 == (unsigned_long *)0x0) {
      uVar2 = pages_00->code_write_count + 1;
      pages_00->code_write_count = uVar2;
      if (uVar2 < 10) goto LAB_00608e58;
      puVar4 = (unsigned_long *)
               g_try_malloc0((long)-(int)uc->init_target_page->mask + 0x3fU >> 3 &
                             0xfffffffffffffff8);
      if (puVar4 == (unsigned_long *)0x0) {
        abort();
      }
      pages_00->code_bitmap = puVar4;
      uVar5 = pages_00->first_tb;
      puVar7 = (undefined8 *)(uVar5 & 0xfffffffffffffffe);
      if (puVar7 != (undefined8 *)0x0) {
        do {
          if ((uVar5 & 1) == 0) {
            uVar1 = (uint)uc->init_target_page->mask;
            uVar3 = (uint)*puVar7 & ~uVar1;
            uVar6 = *(ushort *)((long)puVar7 + 0x14) + uVar3;
            uVar2 = -uVar1;
            if (SBORROW4(uVar6,-uVar1) != (int)(uVar6 + uVar1) < 0) {
              uVar2 = uVar6;
            }
          }
          else {
            uVar3 = 0;
            uVar2 = ~(uint)uc->init_target_page->mask &
                    (uint)*puVar7 + (uint)*(ushort *)((long)puVar7 + 0x14);
          }
          qemu_bitmap_set(pages_00->code_bitmap,(long)(int)uVar3,(long)(int)(uVar2 - uVar3));
          uVar5 = puVar7[(ulong)((uint)uVar5 & 1) + 7];
          puVar7 = (undefined8 *)(uVar5 & 0xfffffffffffffffe);
        } while (puVar7 != (undefined8 *)0x0);
        puVar4 = pages_00->code_bitmap;
        if (puVar4 == (unsigned_long *)0x0) goto LAB_00608e58;
      }
    }
    uVar5 = ~uc->init_target_page->mask & start;
    if (((uint)(puVar4[uVar5 >> 6 & 0x3ffffff] >> ((byte)uVar5 & 0x3f)) &
        ~(-1 << ((byte)len & 0x1f))) != 0) {
LAB_00608e58:
      tb_invalidate_phys_page_range__locked
                (uc,(page_collection *)pages_00,(PageDesc *)start,(long)len + start,retaddr,in_R9);
      return;
    }
  }
  return;
}

Assistant:

void tb_invalidate_phys_page_fast(struct uc_struct *uc, struct page_collection *pages,
                                  tb_page_addr_t start, int len,
                                  uintptr_t retaddr)
{
    PageDesc *p;

    assert_memory_lock();

    p = page_find(uc, start >> TARGET_PAGE_BITS);
    if (!p) {
        return;
    }

    assert_page_locked(p);
    if (!p->code_bitmap &&
        ++p->code_write_count >= SMC_BITMAP_USE_THRESHOLD) {
        build_page_bitmap(uc, p);
    }
    if (p->code_bitmap) {
        unsigned int nr;
        unsigned long b;

        nr = start & ~TARGET_PAGE_MASK;
        b = p->code_bitmap[BIT_WORD(nr)] >> (nr & (BITS_PER_LONG - 1));
        if (b & ((1 << len) - 1)) {
            goto do_invalidate;
        }
    } else {
    do_invalidate:
        tb_invalidate_phys_page_range__locked(uc, pages, p, start, start + len,
                                              retaddr);
    }
}